

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O3

void __thiscall
AVSInterface::AVSInDelegator::Read
          (AVSInDelegator *this,char *name,vector<long,_std::allocator<long>_> *output)

{
  uint uVar1;
  iterator __position;
  char cVar2;
  int iVar3;
  int iVar4;
  AVSValue *pAVar5;
  code *pcVar6;
  long lVar7;
  long *plVar8;
  undefined8 *puVar9;
  int iVar10;
  AVSValue arg;
  long local_48;
  AVSValue local_40;
  
  iVar3 = NameToIndex(this,name);
  if (AVS_linkage != (AVS_Linkage *)0x0) {
    pAVar5 = &this->_args;
    uVar1 = AVS_linkage->Size;
    if (0x508 < uVar1) {
      pcVar6 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
      plVar8 = (long *)((long)&pAVar5->type + *(long *)&AVS_linkage->field_0x510);
      if (((ulong)pcVar6 & 1) != 0) {
        pcVar6 = *(code **)(pcVar6 + *plVar8 + -1);
      }
      pAVar5 = (AVSValue *)(*pcVar6)(plVar8,iVar3);
      if (AVS_linkage == (AVS_Linkage *)0x0) goto LAB_0010e49b;
      uVar1 = AVS_linkage->Size;
    }
    if (0x4d8 < uVar1) {
      pcVar6 = (code *)AVS_linkage->AVSValue_CONSTRUCTOR9;
      plVar8 = (long *)((long)&local_40.type + *(long *)&AVS_linkage->field_0x4e0);
      if (((ulong)pcVar6 & 1) != 0) {
        pcVar6 = *(code **)(pcVar6 + *plVar8 + -1);
      }
      (*pcVar6)(plVar8,pAVar5);
      if (AVS_linkage == (AVS_Linkage *)0x0) goto LAB_0010e49b;
    }
    if (0x578 < (uint)AVS_linkage->Size) {
      pcVar6 = (code *)AVS_linkage->IsArray;
      if (((ulong)pcVar6 & 1) != 0) {
        pcVar6 = *(code **)(pcVar6 + *(long *)((long)&local_40.type +
                                              *(long *)&AVS_linkage->field_0x580) + -1);
      }
      cVar2 = (*pcVar6)();
      if (cVar2 != '\0') {
        iVar3 = 0;
        if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x628 < (uint)AVS_linkage->Size)) {
          pcVar6 = (code *)AVS_linkage->ArraySize;
          if (((ulong)pcVar6 & 1) != 0) {
            pcVar6 = *(code **)(pcVar6 + *(long *)((long)&local_40.type +
                                                  *(long *)&AVS_linkage->field_0x630) + -1);
          }
          iVar3 = (*pcVar6)();
        }
        if (*(long *)(output + 8) != *(long *)output) {
          *(long *)(output + 8) = *(long *)output;
        }
        if (0 < iVar3) {
          iVar10 = 0;
          do {
            iVar4 = 0;
            if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x508 < (uint)AVS_linkage->Size)) {
              pcVar6 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
              plVar8 = (long *)((long)&local_40.type + *(long *)&AVS_linkage->field_0x510);
              if (((ulong)pcVar6 & 1) != 0) {
                pcVar6 = *(code **)(pcVar6 + *plVar8 + -1);
              }
              lVar7 = (*pcVar6)(plVar8,iVar10);
              iVar4 = 0;
              if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x5a8 < (uint)AVS_linkage->Size)) {
                pcVar6 = (code *)AVS_linkage->AsInt1;
                plVar8 = (long *)(lVar7 + *(long *)&AVS_linkage->field_0x5b0);
                if (((ulong)pcVar6 & 1) != 0) {
                  pcVar6 = *(code **)(pcVar6 + *plVar8 + -1);
                }
                iVar4 = (*pcVar6)(plVar8);
              }
            }
            local_48 = (long)iVar4;
            __position._M_current = *(long **)(output + 8);
            if (__position._M_current == *(long **)(output + 0x10)) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (output,__position,&local_48);
            }
            else {
              *__position._M_current = local_48;
              *(long **)(output + 8) = __position._M_current + 1;
            }
            iVar10 = iVar10 + 1;
          } while (iVar3 != iVar10);
        }
        AVSValue::~AVSValue(&local_40);
        return;
      }
    }
  }
LAB_0010e49b:
  puVar9 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar9 = "Argument is not array";
  __cxa_throw(puVar9,&char_const*::typeinfo,0);
}

Assistant:

void Read(const char* name, std::vector<int64_t>& output) override {
      auto arg = _args[NameToIndex(name)];
      if (!arg.IsArray())
        throw "Argument is not array";
      auto size = arg.ArraySize();
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(arg[i].AsInt());
    }